

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<DataStream,transaction_identifier<false>,unsigned_int>
               (DataStream *s,transaction_identifier<false> *args,uint *args_1)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  base_blob<256U>::Serialize<DataStream>((base_blob<256U> *)args,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ser_writedata32<DataStream>(s,*args_1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}